

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

void __thiscall
cm::String::String<std::__cxx11::string,void>
          (String *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined8 local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar1) {
    local_28._vptr__Sp_counted_base = (_func_int **)paVar1->_M_allocated_capacity;
    local_28._8_8_ = *(undefined8 *)((long)&s->field_2 + 8);
    local_58 = &local_28;
  }
  else {
    local_28._vptr__Sp_counted_base = (_func_int **)paVar1->_M_allocated_capacity;
  }
  sVar2 = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  if (local_58 == &local_28) {
    local_48._M_use_count = local_28._M_use_count;
    local_48._M_weak_count = local_28._M_weak_count;
    local_58 = &local_48;
  }
  local_48._vptr__Sp_counted_base = local_28._vptr__Sp_counted_base;
  local_30 = 0;
  local_28._vptr__Sp_counted_base =
       (_func_int **)((ulong)local_28._vptr__Sp_counted_base & 0xffffffffffffff00);
  local_38 = &local_28;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008bca70;
  p_Var4 = p_Var3 + 2;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  if (local_58 == &local_48) {
    p_Var4->_vptr__Sp_counted_base = local_48._vptr__Sp_counted_base;
    p_Var3[2]._M_use_count = local_48._M_use_count;
    p_Var3[2]._M_weak_count = local_48._M_weak_count;
  }
  else {
    (((element_type *)(p_Var3 + 1))->_M_dataplus)._M_p = (pointer)local_58;
    p_Var4->_vptr__Sp_counted_base = local_48._vptr__Sp_counted_base;
    p_Var4 = local_58;
  }
  p_Var3[1]._M_use_count = (int)sVar2;
  p_Var3[1]._M_weak_count = (int)(sVar2 >> 0x20);
  local_48._vptr__Sp_counted_base =
       (_func_int **)((ulong)local_48._vptr__Sp_counted_base & 0xffffffffffffff00);
  (this->string_).
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var3 + 1);
  (this->string_).
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var3;
  (this->view_)._M_len = sVar2;
  (this->view_)._M_str = (char *)p_Var4;
  if (local_38 != &local_28) {
    operator_delete(local_38,(long)local_28._vptr__Sp_counted_base + 1);
  }
  return;
}

Assistant:

String(T&& s)
    : String(IntoString<T>::into_string(std::forward<T>(s)), Private())
  {
  }